

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O1

void __thiscall
kwssys::Glob::ProcessDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  size_type sVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  Status SVar8;
  unsigned_long uVar9;
  char *__s;
  long *plVar10;
  size_type *psVar11;
  _Alloc_hider _Var12;
  RegularExpression *this_00;
  Directory d;
  string fname;
  string realname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Directory local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  size_type local_70;
  GlobMessages *local_68;
  long local_60;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar7 = ((long)(this->Internals->Expressions).
                 super__Vector_base<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->Internals->Expressions).
                 super__Vector_base<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5075075075075075;
  sVar1 = uVar7 - 1;
  if ((sVar1 == start) && (this->Recurse == true)) {
    bVar5 = SystemTools::FileIsDirectory(dir);
    if (bVar5) {
      RecurseDirectory(this,start,dir,messages);
      return;
    }
  }
  else if (start <= uVar7 && uVar7 - start != 0) {
    Directory::Directory(&local_d8);
    SVar8 = Directory::Load(&local_d8,dir,(string *)0x0);
    if (SVar8.Kind_ == Success) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      paVar2 = &local_50.field_2;
      local_70 = start + 1;
      local_60 = start * 0x230;
      local_68 = messages;
      for (uVar7 = 0; uVar9 = Directory::GetNumberOfFiles(&local_d8), uVar7 < uVar9;
          uVar7 = uVar7 + 1) {
        __s = Directory::GetFile(&local_d8,uVar7);
        sVar4 = local_d0._M_string_length;
        local_58 = uVar7;
        strlen(__s);
        uVar7 = local_58;
        std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)sVar4,(ulong)__s);
        iVar6 = std::__cxx11::string::compare((char *)&local_d0);
        if ((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)&local_d0), iVar6 != 0))
        {
          if (start == 0) {
            std::operator+(&local_50,dir,&local_d0);
            std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
            _Var12._M_p = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar2) goto LAB_0015f5e0;
          }
          else {
            local_90[0] = &local_80;
            pcVar3 = (dir->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar3,pcVar3 + dir->_M_string_length);
            std::__cxx11::string::append((char *)local_90);
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)local_90,(ulong)local_d0._M_dataplus._M_p);
            psVar11 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_50.field_2._M_allocated_capacity = *psVar11;
              local_50.field_2._8_8_ = plVar10[3];
              local_50._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_50.field_2._M_allocated_capacity = *psVar11;
              local_50._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_50._M_string_length = plVar10[1];
            *plVar10 = (long)psVar11;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            _Var12._M_p = (pointer)local_90[0];
            if (local_90[0] != &local_80) {
LAB_0015f5e0:
              operator_delete(_Var12._M_p);
            }
          }
          if ((((sVar1 == start) || (bVar5 = SystemTools::FileIsDirectory(&local_b0), bVar5)) &&
              ((sVar1 != start ||
               ((this->ListDirs != false ||
                (bVar5 = SystemTools::FileIsDirectory(&local_b0), !bVar5)))))) &&
             (this_00 = (RegularExpression *)
                        ((long)(((this->Internals->Expressions).
                                 super__Vector_base<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->regmatch).startp +
                        local_60),
             bVar5 = RegularExpression::find
                               (this_00,local_d0._M_dataplus._M_p,(RegularExpressionMatch *)this_00)
             , bVar5)) {
            if (sVar1 == start) {
              AddFile(this,&this->Internals->Files,&local_b0);
            }
            else {
              ProcessDirectory(this,local_70,&local_b0,local_68);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    Directory::~Directory(&local_d8);
  }
  return;
}

Assistant:

void Glob::ProcessDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  // std::cout << "ProcessDirectory: " << dir << std::endl;
  bool last = (start == this->Internals->Expressions.size() - 1);
  if (last && this->Recurse) {
    if (kwsys::SystemTools::FileIsDirectory(dir)) {
      this->RecurseDirectory(start, dir, messages);
    }
    return;
  }

  if (start >= this->Internals->Expressions.size()) {
    return;
  }

  kwsys::Directory d;
  if (!d.Load(dir)) {
    return;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On case-insensitive file systems convert to lower case for matching.
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    // std::cout << "Look at file: " << fname << std::endl;
    // std::cout << "Match: "
    // << this->Internals->TextExpressions[start].c_str() << std::endl;
    // std::cout << "Real name: " << realname << std::endl;

    if ((!last && !kwsys::SystemTools::FileIsDirectory(realname)) ||
        (!this->ListDirs && last &&
         kwsys::SystemTools::FileIsDirectory(realname))) {
      continue;
    }

    if (this->Internals->Expressions[start].find(fname)) {
      if (last) {
        this->AddFile(this->Internals->Files, realname);
      } else {
        this->ProcessDirectory(start + 1, realname, messages);
      }
    }
  }
}